

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::core::Engine::Flush(Engine *this,int param_2)

{
  string *in_stack_000000b8;
  Engine *in_stack_000000c0;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Flush",&local_31);
  ThrowUp(in_stack_000000c0,in_stack_000000b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void Engine::Flush(const int /*transportIndex*/) { ThrowUp("Flush"); }